

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O0

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob)

{
  bool bVar1;
  float *pfVar2;
  Mat *pMVar3;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  float fVar4;
  int i_8;
  float scale_3;
  int i_7;
  float scale_2;
  int i_6;
  float scale_1;
  int i_5;
  float scale;
  float val_1;
  int k_1;
  float sum_1;
  float *sptr_1;
  int j_2;
  int i_4;
  float *outptr_1;
  Mat m_1;
  int q_3;
  float val;
  int k;
  float max_1;
  float *sptr;
  int j_1;
  int i_3;
  float *outptr;
  Mat m;
  int q_2;
  int j;
  int i_2;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  int hpad;
  int wpad;
  int htail;
  int wtail;
  int htailpad;
  int wtailpad;
  float pad_value;
  Mat bottom_blob_bordered;
  int i_1;
  float sum;
  float *ptr_1;
  int q_1;
  int i;
  float max;
  float *ptr;
  int q;
  int size;
  int channels;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffc00;
  int in_stack_fffffffffffffc04;
  Mat *in_stack_fffffffffffffc08;
  Mat *in_stack_fffffffffffffc10;
  size_type in_stack_fffffffffffffc18;
  Mat *in_stack_fffffffffffffc20;
  float in_stack_fffffffffffffc74;
  int right;
  undefined8 in_stack_fffffffffffffc78;
  int left;
  int bottom;
  undefined8 in_stack_fffffffffffffc80;
  int top;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  Mat *in_stack_fffffffffffffc90;
  int type;
  int local_354;
  Mat local_350;
  float local_320;
  int local_31c;
  Mat local_318;
  float local_2e8;
  int local_2e4;
  Mat local_2e0;
  float local_2b0;
  int local_2ac;
  Mat local_2a8;
  float local_278;
  float local_274;
  int local_270;
  float local_26c;
  float *local_268;
  int local_260;
  int local_25c;
  Mat local_258;
  Mat *local_228;
  Mat local_220;
  int local_1f0;
  float local_1ec;
  int local_1e8;
  float local_1e4;
  float *local_1e0;
  int local_1d8;
  int local_1d4;
  Mat local_1d0;
  float *local_1a0;
  Mat local_198;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  reference local_150;
  vector<int,_std::allocator<int>_> local_140;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  undefined4 local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  undefined4 local_fc;
  Mat local_f8;
  int local_c8;
  float local_c4;
  Mat local_c0;
  float *local_90;
  int local_88;
  int local_84;
  float local_80 [4];
  Mat local_70;
  float *local_40;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  Mat *local_20;
  int local_4;
  
  local_24 = in_RSI->w;
  local_28 = in_RSI->h;
  local_2c = in_RSI->c;
  if (*(int *)(in_RDI + 0xa4) != 0) {
    local_20 = in_RDX;
    Mat::create(in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    if (!bVar1) {
      local_30 = local_24 * local_28;
      if (*(int *)(in_RDI + 0x80) == 0) {
        for (local_34 = 0; local_34 < local_2c; local_34 = local_34 + 1) {
          pMVar3 = &local_70;
          Mat::channel(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
          pfVar2 = Mat::operator_cast_to_float_(pMVar3);
          Mat::~Mat((Mat *)0x11c860);
          local_80[0] = *pfVar2;
          local_40 = pfVar2;
          for (local_84 = 0; local_84 < local_30; local_84 = local_84 + 1) {
            pfVar2 = std::max<float>(local_80,local_40 + local_84);
            local_80[0] = *pfVar2;
          }
          fVar4 = local_80[0];
          pfVar2 = Mat::operator[](local_20,local_34);
          *pfVar2 = fVar4;
        }
      }
      else if (*(int *)(in_RDI + 0x80) == 1) {
        for (local_88 = 0; local_88 < local_2c; local_88 = local_88 + 1) {
          pMVar3 = &local_c0;
          Mat::channel(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
          pfVar2 = Mat::operator_cast_to_float_(pMVar3);
          Mat::~Mat((Mat *)0x11c9d4);
          local_c4 = 0.0;
          for (local_c8 = 0; local_c8 < local_30; local_c8 = local_c8 + 1) {
            local_c4 = pfVar2[local_c8] + local_c4;
          }
          fVar4 = local_c4 / (float)local_30;
          local_90 = pfVar2;
          pfVar2 = Mat::operator[](local_20,local_88);
          *pfVar2 = fVar4;
        }
      }
      return 0;
    }
    return -100;
  }
  Mat::Mat(&local_f8,in_RSI);
  if (*(int *)(in_RDI + 0x80) == 0) {
    local_fc = 0xff7fffff;
  }
  else {
    local_fc = 0;
  }
  local_100 = 0;
  local_104 = 0;
  right = (int)in_stack_fffffffffffffc78;
  left = (int)((ulong)in_stack_fffffffffffffc78 >> 0x20);
  bottom = (int)in_stack_fffffffffffffc80;
  top = (int)((ulong)in_stack_fffffffffffffc80 >> 0x20);
  type = (int)in_RDI;
  if (*(int *)(in_RDI + 0xa8) == 0) {
    local_108 = ((local_24 + *(int *)(in_RDI + 0x94) + *(int *)(in_RDI + 0x98)) -
                *(int *)(in_RDI + 0x84)) % *(int *)(in_RDI + 0x8c);
    local_10c = ((local_28 + *(int *)(in_RDI + 0x9c) + *(int *)(in_RDI + 0xa0)) -
                *(int *)(in_RDI + 0x88)) % *(int *)(in_RDI + 0x90);
    if (local_108 != 0) {
      local_100 = *(int *)(in_RDI + 0x8c) - local_108;
    }
    if (local_10c != 0) {
      local_104 = *(int *)(in_RDI + 0x90) - local_10c;
    }
    copy_make_border(in_stack_fffffffffffffc90,
                     (Mat *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),top,bottom
                     ,left,right,type,in_stack_fffffffffffffc74);
    bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    if (bVar1) {
      local_4 = -100;
      local_110 = 1;
      goto LAB_0011db65;
    }
    local_24 = local_f8.w;
    local_28 = local_f8.h;
  }
  else if (*(int *)(in_RDI + 0xa8) == 1) {
    copy_make_border(in_stack_fffffffffffffc90,
                     (Mat *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),top,bottom
                     ,left,right,type,in_stack_fffffffffffffc74);
    bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
    if (bVar1) {
      local_4 = -100;
      local_110 = 1;
      goto LAB_0011db65;
    }
    local_24 = local_f8.w;
    local_28 = local_f8.h;
  }
  else if (*(int *)(in_RDI + 0xa8) == 2) {
    local_114 = (*(int *)(in_RDI + 0x84) +
                ((local_24 + -1) / *(int *)(in_RDI + 0x8c)) * *(int *)(in_RDI + 0x8c)) - local_24;
    local_118 = (*(int *)(in_RDI + 0x88) +
                ((local_28 + -1) / *(int *)(in_RDI + 0x90)) * *(int *)(in_RDI + 0x90)) - local_28;
    if ((0 < local_114) || (0 < local_118)) {
      copy_make_border(in_stack_fffffffffffffc90,
                       (Mat *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),top,
                       bottom,left,right,type,in_stack_fffffffffffffc74);
      bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
      if (bVar1) {
        local_4 = -100;
        local_110 = 1;
        goto LAB_0011db65;
      }
    }
    local_24 = local_f8.w;
    local_28 = local_f8.h;
  }
  local_11c = (local_24 - *(int *)(in_RDI + 0x84)) / *(int *)(in_RDI + 0x8c) + 1;
  local_120 = (local_28 - *(int *)(in_RDI + 0x88)) / *(int *)(in_RDI + 0x90) + 1;
  Mat::create(in_stack_fffffffffffffc20,(int)(in_stack_fffffffffffffc18 >> 0x20),
              (int)in_stack_fffffffffffffc18,(int)((ulong)in_stack_fffffffffffffc10 >> 0x20),
              (size_t)in_stack_fffffffffffffc08);
  bVar1 = Mat::empty((Mat *)CONCAT44(in_stack_fffffffffffffc04,in_stack_fffffffffffffc00));
  if (bVar1) {
    local_4 = -100;
    local_110 = 1;
  }
  else {
    local_124 = *(int *)(in_RDI + 0x84) * *(int *)(in_RDI + 0x88);
    std::allocator<int>::allocator((allocator<int> *)0x11cfd0);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc20,
               in_stack_fffffffffffffc18,(allocator_type *)in_stack_fffffffffffffc10);
    std::allocator<int>::~allocator((allocator<int> *)0x11cff6);
    local_150 = std::vector<int,_std::allocator<int>_>::operator[](&local_140,0);
    local_154 = 0;
    local_158 = 0;
    local_15c = local_24 - *(int *)(in_RDI + 0x84);
    for (local_160 = 0; local_160 < *(int *)(in_RDI + 0x88); local_160 = local_160 + 1) {
      for (local_164 = 0; local_164 < *(int *)(in_RDI + 0x84); local_164 = local_164 + 1) {
        local_150[local_154] = local_158;
        local_154 = local_154 + 1;
        local_158 = local_158 + 1;
      }
      local_158 = local_15c + local_158;
    }
    if (*(int *)(in_RDI + 0x80) == 0) {
      for (local_168 = 0; local_168 < local_2c; local_168 = local_168 + 1) {
        Mat::channel(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
        Mat::channel(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
        pfVar2 = Mat::operator_cast_to_float_(&local_1d0);
        Mat::~Mat((Mat *)0x11d1ba);
        local_1a0 = pfVar2;
        for (local_1d4 = 0; local_1d4 < local_120; local_1d4 = local_1d4 + 1) {
          for (local_1d8 = 0; local_1d8 < local_11c; local_1d8 = local_1d8 + 1) {
            local_1e0 = Mat::row(&local_198,local_1d4 * *(int *)(in_RDI + 0x90));
            local_1e0 = local_1e0 + local_1d8 * *(int *)(in_RDI + 0x8c);
            local_1e4 = *local_1e0;
            for (local_1e8 = 0; local_1e8 < local_124; local_1e8 = local_1e8 + 1) {
              local_1ec = local_1e0[local_150[local_1e8]];
              pfVar2 = std::max<float>(&local_1e4,&local_1ec);
              local_1e4 = *pfVar2;
            }
            local_1a0[local_1d8] = local_1e4;
          }
          local_1a0 = local_1a0 + local_11c;
        }
        Mat::~Mat((Mat *)0x11d3cd);
      }
    }
    else if (*(int *)(in_RDI + 0x80) == 1) {
      for (local_1f0 = 0; local_1f0 < local_2c; local_1f0 = local_1f0 + 1) {
        Mat::channel(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
        Mat::channel(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
        pMVar3 = (Mat *)Mat::operator_cast_to_float_(&local_258);
        Mat::~Mat((Mat *)0x11d48b);
        local_228 = pMVar3;
        for (local_25c = 0; local_25c < local_120; local_25c = local_25c + 1) {
          for (local_260 = 0; local_260 < local_11c; local_260 = local_260 + 1) {
            local_268 = Mat::row(&local_220,local_25c * *(int *)(in_RDI + 0x90));
            local_268 = local_268 + local_260 * *(int *)(in_RDI + 0x8c);
            local_26c = 0.0;
            for (local_270 = 0; local_270 < local_124; local_270 = local_270 + 1) {
              local_274 = local_268[local_150[local_270]];
              local_26c = local_274 + local_26c;
            }
            *(float *)((long)&local_228->data + (long)local_260 * 4) = local_26c / (float)local_124;
          }
          local_228 = (Mat *)((long)&local_228->data + (long)local_11c * 4);
        }
        if (*(int *)(in_RDI + 0x9c) != 0) {
          local_278 = (float)*(int *)(in_RDI + 0x88) /
                      (float)(*(int *)(in_RDI + 0x88) - *(int *)(in_RDI + 0x9c));
          Mat::channel(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
          local_228 = (Mat *)Mat::row(&local_2a8,0);
          Mat::~Mat((Mat *)0x11d6f7);
          for (local_2ac = 0; local_2ac < local_11c; local_2ac = local_2ac + 1) {
            *(float *)((long)&local_228->data + (long)local_2ac * 4) =
                 local_278 * *(float *)((long)&local_228->data + (long)local_2ac * 4);
          }
        }
        if (*(int *)(in_RDI + 0xa0) + local_104 != 0) {
          local_2b0 = (float)*(int *)(in_RDI + 0x88) /
                      (float)((*(int *)(in_RDI + 0x88) - *(int *)(in_RDI + 0xa0)) - local_104);
          Mat::channel(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
          local_228 = (Mat *)Mat::row(&local_2e0,local_120 + -1);
          Mat::~Mat((Mat *)0x11d817);
          for (local_2e4 = 0; local_2e4 < local_11c; local_2e4 = local_2e4 + 1) {
            *(float *)((long)&local_228->data + (long)local_2e4 * 4) =
                 local_2b0 * *(float *)((long)&local_228->data + (long)local_2e4 * 4);
          }
        }
        if (*(int *)(in_RDI + 0x94) != 0) {
          local_2e8 = (float)*(int *)(in_RDI + 0x84) /
                      (float)(*(int *)(in_RDI + 0x84) - *(int *)(in_RDI + 0x94));
          Mat::channel(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
          in_stack_fffffffffffffc10 = (Mat *)Mat::operator_cast_to_float_(&local_318);
          local_228 = in_stack_fffffffffffffc10;
          Mat::~Mat((Mat *)0x11d91c);
          for (local_31c = 0; local_31c < local_120; local_31c = local_31c + 1) {
            *(float *)&local_228->data = local_2e8 * *(float *)&local_228->data;
            local_228 = (Mat *)((long)&local_228->data + (long)local_11c * 4);
          }
        }
        if (*(int *)(in_RDI + 0x98) + local_100 != 0) {
          local_320 = (float)*(int *)(in_RDI + 0x84) /
                      (float)((*(int *)(in_RDI + 0x84) - *(int *)(in_RDI + 0x98)) - local_100);
          Mat::channel(in_stack_fffffffffffffc08,in_stack_fffffffffffffc04);
          in_stack_fffffffffffffc08 = (Mat *)Mat::operator_cast_to_float_(&local_350);
          local_228 = in_stack_fffffffffffffc08;
          Mat::~Mat((Mat *)0x11da4a);
          local_228 = (Mat *)((long)&local_228->data + (long)(local_11c + -1) * 4);
          for (local_354 = 0; local_354 < local_120; local_354 = local_354 + 1) {
            *(float *)&local_228->data = local_320 * *(float *)&local_228->data;
            local_228 = (Mat *)((long)&local_228->data + (long)local_11c * 4);
          }
        }
        Mat::~Mat((Mat *)0x11db08);
      }
    }
    local_4 = 0;
    local_110 = 1;
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc10);
  }
LAB_0011db65:
  Mat::~Mat((Mat *)0x11db72);
  return local_4;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;

//     fprintf(stderr, "Pooling     input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i=0; i<size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for
            for (int q=0; q<channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i=0; i<size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;
    int htailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;
        int htail = (h + pad_top + pad_bottom - kernel_h) % stride_h;

        if (wtail != 0)
            wtailpad = stride_w - wtail;
        if (htail != 0)
            htailpad = stride_h - htail;

        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom + htailpad, pad_left, pad_right + wtailpad, BORDER_CONSTANT, pad_value);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 1) // valid padding
    {
        copy_make_border(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, BORDER_CONSTANT, pad_value);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_mode == 2) // tensorflow padding=SAME
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, pad_value);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    float sum = 0;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[ space_ofs[k] ];
                        sum += val;
                    }

                    outptr[j] = sum / maxk;
                }

                outptr += outw;
            }

            // fix pad
            if (pad_top != 0)
            {
                const float scale = (float)kernel_h / (kernel_h - pad_top);

                outptr = top_blob.channel(q).row(0);
                for (int i = 0; i < outw; i++)
                {
                    outptr[i] *= scale;
                }
            }
            if (pad_bottom + htailpad != 0)
            {
                const float scale = (float)kernel_h / (kernel_h - pad_bottom - htailpad);

                outptr = top_blob.channel(q).row(outh - 1);
                for (int i = 0; i < outw; i++)
                {
                    outptr[i] *= scale;
                }
            }
            if (pad_left != 0)
            {
                const float scale = (float)kernel_w / (kernel_w - pad_left);

                outptr = top_blob.channel(q);
                for (int i = 0; i < outh; i++)
                {
                    *outptr *= scale;
                    outptr += outw;
                }
            }
            if (pad_right + wtailpad != 0)
            {
                const float scale = (float)kernel_w / (kernel_w - pad_right - wtailpad);

                outptr = top_blob.channel(q);
                outptr += outw - 1;
                for (int i = 0; i < outh; i++)
                {
                    *outptr *= scale;
                    outptr += outw;
                }
            }
        }
    }

    return 0;
}